

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# squeeze.c
# Opt level: O3

void ZopfliLZ77Optimal(ZopfliBlockState *s,uchar *in,size_t instart,size_t inend,int numiterations,
                      ZopfliLZ77Store *store)

{
  size_t *count;
  double *bitlengths;
  double *bitlengths_00;
  uint uVar1;
  unsigned_short *length_array;
  float *costs;
  long lVar2;
  ulong uVar3;
  ulong uVar4;
  unsigned_short *__ptr;
  double dVar5;
  double dVar6;
  double dVar7;
  uint local_3d5c;
  double local_3d50;
  unsigned_short *path;
  ZopfliLZ77Store *local_3cf8;
  double *local_3cf0;
  size_t *local_3ce8;
  double *local_3ce0;
  double local_3cd8;
  size_t pathsize;
  RanState ran_state;
  ZopfliLZ77Store currentstore;
  ZopfliHash hash;
  SymbolStats stats;
  SymbolStats laststats;
  SymbolStats beststats;
  
  local_3cf8 = store;
  length_array = (unsigned_short *)malloc((inend - instart) * 2 + 2);
  path = (unsigned_short *)0x0;
  pathsize = 0;
  costs = (float *)malloc((inend - instart) * 4 + 4);
  if ((costs != (float *)0x0) && (length_array != (unsigned_short *)0x0)) {
    ran_state.m_w = 1;
    ran_state.m_z = 2;
    memset(&stats,0,0x1400);
    ZopfliInitLZ77Store(in,&currentstore);
    ZopfliAllocHash(0x8000,&hash);
    ZopfliLZ77Greedy(s,in,instart,inend,&currentstore,&hash);
    GetStatistics(&currentstore,&stats);
    __ptr = (unsigned_short *)0x0;
    if (0 < numiterations) {
      count = stats.dists;
      bitlengths = stats.ll_symbols;
      bitlengths_00 = stats.d_symbols;
      local_3ce8 = laststats.dists;
      local_3cf0 = laststats.ll_symbols;
      local_3ce0 = laststats.d_symbols;
      local_3d50 = 1e+30;
      dVar5 = 0.0;
      local_3d5c = 0xffffffff;
      uVar1 = 0;
      do {
        local_3cd8 = dVar5;
        ZopfliCleanLZ77Store(&currentstore);
        ZopfliInitLZ77Store(in,&currentstore);
        LZ77OptimalRun(s,in,instart,inend,&path,&pathsize,length_array,GetCostStat,&stats,
                       &currentstore,&hash,costs);
        dVar5 = ZopfliCalculateBlockSize(&currentstore,0,currentstore.size,2);
        if ((s->options->verbose_more != 0) || ((s->options->verbose != 0 && (dVar5 < local_3d50))))
        {
          fprintf(_stderr,"Iteration %d: %d bit\n",(ulong)uVar1,(ulong)(uint)(int)dVar5);
        }
        if (dVar5 < local_3d50) {
          ZopfliCopyLZ77Store(&currentstore,local_3cf8);
          memcpy(&beststats,&stats,0x900);
          memcpy(beststats.dists,count,0x100);
          memcpy(beststats.ll_symbols,bitlengths,0x900);
          memcpy(beststats.d_symbols,bitlengths_00,0x100);
          local_3d50 = dVar5;
        }
        memcpy(&laststats,&stats,0x900);
        memcpy(local_3ce8,count,0x100);
        memcpy(local_3cf0,bitlengths,0x900);
        memcpy(local_3ce0,bitlengths_00,0x100);
        memset(&stats,0,0xa00);
        GetStatistics(&currentstore,&stats);
        if (local_3d5c != 0xffffffff) {
          lVar2 = 0;
          do {
            dVar6 = (((double)(laststats.litlens[lVar2] >> 0x20 | 0x4530000000000000) -
                     1.9342813118337666e+25) +
                    (double)(laststats.litlens[lVar2] & 0xffffffff | 0x4330000000000000)) * 0.5 +
                    ((double)(stats.litlens[lVar2] >> 0x20 | 0x4530000000000000) -
                    1.9342813118337666e+25) +
                    (double)(stats.litlens[lVar2] & 0xffffffff | 0x4330000000000000);
            dVar7 = (((double)(laststats.litlens[lVar2 + 1] >> 0x20 | 0x4530000000000000) -
                     1.9342813118337666e+25) +
                    (double)(laststats.litlens[lVar2 + 1] & 0xffffffff | 0x4330000000000000)) * 0.5
                    + ((double)(stats.litlens[lVar2 + 1] >> 0x20 | 0x4530000000000000) -
                      1.9342813118337666e+25) +
                      (double)(stats.litlens[lVar2 + 1] & 0xffffffff | 0x4330000000000000);
            uVar3 = (ulong)dVar6;
            uVar4 = (ulong)dVar7;
            stats.litlens[lVar2] =
                 (long)(dVar6 - 9.223372036854776e+18) & (long)uVar3 >> 0x3f | uVar3;
            stats.litlens[lVar2 + 1] =
                 (long)(dVar7 - 9.223372036854776e+18) & (long)uVar4 >> 0x3f | uVar4;
            lVar2 = lVar2 + 2;
          } while (lVar2 != 0x120);
          lVar2 = 0x120;
          do {
            dVar6 = (((double)(laststats.litlens[lVar2] >> 0x20 | 0x4530000000000000) -
                     1.9342813118337666e+25) +
                    (double)(laststats.litlens[lVar2] & 0xffffffff | 0x4330000000000000)) * 0.5 +
                    ((double)(stats.litlens[lVar2] >> 0x20 | 0x4530000000000000) -
                    1.9342813118337666e+25) +
                    (double)(stats.litlens[lVar2] & 0xffffffff | 0x4330000000000000);
            dVar7 = (((double)(laststats.litlens[lVar2 + 1] >> 0x20 | 0x4530000000000000) -
                     1.9342813118337666e+25) +
                    (double)(laststats.litlens[lVar2 + 1] & 0xffffffff | 0x4330000000000000)) * 0.5
                    + ((double)(stats.litlens[lVar2 + 1] >> 0x20 | 0x4530000000000000) -
                      1.9342813118337666e+25) +
                      (double)(stats.litlens[lVar2 + 1] & 0xffffffff | 0x4330000000000000);
            uVar3 = (ulong)dVar6;
            uVar4 = (ulong)dVar7;
            stats.litlens[lVar2] =
                 (long)(dVar6 - 9.223372036854776e+18) & (long)uVar3 >> 0x3f | uVar3;
            stats.litlens[lVar2 + 1] =
                 (long)(dVar7 - 9.223372036854776e+18) & (long)uVar4 >> 0x3f | uVar4;
            lVar2 = lVar2 + 2;
          } while (lVar2 != 0x140);
          stats.litlens[0x100] = 1;
          ZopfliCalculateEntropy(stats.litlens,0x120,bitlengths);
          ZopfliCalculateEntropy(count,0x20,bitlengths_00);
        }
        if (5 < uVar1) {
          if ((dVar5 == local_3cd8) && (!NAN(dVar5) && !NAN(local_3cd8))) {
            memcpy(&stats,&beststats,0x900);
            memcpy(count,beststats.dists,0x100);
            memcpy(bitlengths,beststats.ll_symbols,0x900);
            memcpy(bitlengths_00,beststats.d_symbols,0x100);
            RandomizeFreqs(&ran_state,stats.litlens,0x120);
            RandomizeFreqs(&ran_state,count,0x20);
            stats.litlens[0x100] = 1;
            ZopfliCalculateEntropy(stats.litlens,0x120,bitlengths);
            ZopfliCalculateEntropy(count,0x20,bitlengths_00);
            local_3d5c = uVar1;
          }
        }
        uVar1 = uVar1 + 1;
        __ptr = path;
      } while (uVar1 != numiterations);
    }
    free(length_array);
    free(__ptr);
    free(costs);
    ZopfliCleanLZ77Store(&currentstore);
    ZopfliCleanHash(&hash);
    return;
  }
  exit(-1);
}

Assistant:

void ZopfliLZ77Optimal(ZopfliBlockState *s,
                       const unsigned char* in, size_t instart, size_t inend,
                       int numiterations,
                       ZopfliLZ77Store* store) {
  /* Dist to get to here with smallest cost. */
  size_t blocksize = inend - instart;
  unsigned short* length_array =
      (unsigned short*)malloc(sizeof(unsigned short) * (blocksize + 1));
  unsigned short* path = 0;
  size_t pathsize = 0;
  ZopfliLZ77Store currentstore;
  ZopfliHash hash;
  ZopfliHash* h = &hash;
  SymbolStats stats, beststats, laststats;
  int i;
  float* costs = (float*)malloc(sizeof(float) * (blocksize + 1));
  double cost;
  double bestcost = ZOPFLI_LARGE_FLOAT;
  double lastcost = 0;
  /* Try randomizing the costs a bit once the size stabilizes. */
  RanState ran_state;
  int lastrandomstep = -1;

  if (!costs) exit(-1); /* Allocation failed. */
  if (!length_array) exit(-1); /* Allocation failed. */

  InitRanState(&ran_state);
  InitStats(&stats);
  ZopfliInitLZ77Store(in, &currentstore);
  ZopfliAllocHash(ZOPFLI_WINDOW_SIZE, h);

  /* Do regular deflate, then loop multiple shortest path runs, each time using
  the statistics of the previous run. */

  /* Initial run. */
  ZopfliLZ77Greedy(s, in, instart, inend, &currentstore, h);
  GetStatistics(&currentstore, &stats);

  /* Repeat statistics with each time the cost model from the previous stat
  run. */
  for (i = 0; i < numiterations; i++) {
    ZopfliCleanLZ77Store(&currentstore);
    ZopfliInitLZ77Store(in, &currentstore);
    LZ77OptimalRun(s, in, instart, inend, &path, &pathsize,
                   length_array, GetCostStat, (void*)&stats,
                   &currentstore, h, costs);
    cost = ZopfliCalculateBlockSize(&currentstore, 0, currentstore.size, 2);
    if (s->options->verbose_more || (s->options->verbose && cost < bestcost)) {
      fprintf(stderr, "Iteration %d: %d bit\n", i, (int) cost);
    }
    if (cost < bestcost) {
      /* Copy to the output store. */
      ZopfliCopyLZ77Store(&currentstore, store);
      CopyStats(&stats, &beststats);
      bestcost = cost;
    }
    CopyStats(&stats, &laststats);
    ClearStatFreqs(&stats);
    GetStatistics(&currentstore, &stats);
    if (lastrandomstep != -1) {
      /* This makes it converge slower but better. Do it only once the
      randomness kicks in so that if the user does few iterations, it gives a
      better result sooner. */
      AddWeighedStatFreqs(&stats, 1.0, &laststats, 0.5, &stats);
      CalculateStatistics(&stats);
    }
    if (i > 5 && cost == lastcost) {
      CopyStats(&beststats, &stats);
      RandomizeStatFreqs(&ran_state, &stats);
      CalculateStatistics(&stats);
      lastrandomstep = i;
    }
    lastcost = cost;
  }

  free(length_array);
  free(path);
  free(costs);
  ZopfliCleanLZ77Store(&currentstore);
  ZopfliCleanHash(h);
}